

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_log_alert *this)

{
  char *pcVar1;
  char *pcVar2;
  allocator<char> local_3a9;
  char local_3a8 [8];
  char ret [900];
  dht_log_alert *this_local;
  
  pcVar1 = message::dht_modules[this->module];
  pcVar2 = log_message(this);
  snprintf(local_3a8,900,"DHT %s: %s",pcVar1,pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_3a8,&local_3a9);
  std::allocator<char>::~allocator(&local_3a9);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_log_alert::message() const
	{
		static char const* const dht_modules[] =
		{
			"tracker",
			"node",
			"routing_table",
			"rpc_manager",
			"traversal"
		};

		char ret[900];
		std::snprintf(ret, sizeof(ret), "DHT %s: %s", dht_modules[module]
			, log_message());
		return ret;
	}